

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

void __thiscall
simdjson::internal::unsupported_implementation::unsupported_implementation
          (unsupported_implementation *this)

{
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_name_abi_cxx11__001ef548;
  (this->super_implementation)._name._M_dataplus._M_p =
       (pointer)&(this->super_implementation)._name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_implementation)._name,"unsupported","");
  (this->super_implementation)._description._M_dataplus._M_p =
       (pointer)&(this->super_implementation)._description.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_implementation)._description,
             "Unsupported CPU (no detected SIMD instructions)","");
  (this->super_implementation)._required_instruction_sets = 0;
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_name_abi_cxx11__001ef600;
  return;
}

Assistant:

unsupported_implementation() : implementation("unsupported", "Unsupported CPU (no detected SIMD instructions)", 0) {}